

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layers.c
# Opt level: O0

int mapIsland(Layer *l,int *out,int x,int z,int w,int h)

{
  int iVar1;
  long lVar2;
  uint64_t s;
  int in_ECX;
  int in_EDX;
  long in_RSI;
  long in_RDI;
  int in_R8D;
  int in_R9D;
  int v11;
  uint64_t cs;
  uint64_t ss;
  int err;
  int64_t j;
  int64_t i;
  int64_t pH;
  int64_t pW;
  int pZ;
  int pX;
  int in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff8c;
  uint in_stack_ffffffffffffff90;
  long local_50;
  long local_48;
  int local_4;
  
  lVar2 = (long)(in_R8D + 2);
  local_4 = (*(code *)**(undefined8 **)(in_RDI + 0x38))
                      (*(undefined8 *)(in_RDI + 0x38),in_RSI,in_EDX + -1,in_ECX + -1,lVar2,
                       (long)(in_R9D + 2));
  if (local_4 == 0) {
    for (local_50 = 0; local_50 < in_R9D; local_50 = local_50 + 1) {
      for (local_48 = 0; local_48 < in_R8D; local_48 = local_48 + 1) {
        iVar1 = *(int *)(in_RSI + (local_48 + 1 + (local_50 + 1) * lVar2) * 4);
        *(int *)(in_RSI + (local_48 + local_50 * in_R8D) * 4) = iVar1;
        if ((((iVar1 == 0) && (*(int *)(in_RSI + (local_48 + 1 + local_50 * lVar2) * 4) == 0)) &&
            (*(int *)(in_RSI + (local_48 + 2 + (local_50 + 1) * lVar2) * 4) == 0)) &&
           ((*(int *)(in_RSI + (local_48 + (local_50 + 1) * lVar2) * 4) == 0 &&
            (*(int *)(in_RSI + (local_48 + 1 + (local_50 + 2) * lVar2) * 4) == 0)))) {
          s = getChunkSeed((ulong)in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c,
                           in_stack_ffffffffffffff88);
          iVar1 = mcFirstIsZero(s,2);
          if (iVar1 != 0) {
            *(undefined4 *)(in_RSI + (local_48 + local_50 * in_R8D) * 4) = 1;
          }
        }
      }
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int mapIsland(const Layer * l, int * out, int x, int z, int w, int h)
{
    int pX = x - 1;
    int pZ = z - 1;
    int64_t pW = w + 2;
    int64_t pH = h + 2;
    int64_t i, j;

    int err = l->p->getMap(l->p, out, pX, pZ, pW, pH);
    if unlikely(err != 0)
        return err;

    uint64_t ss = l->startSeed;
    uint64_t cs;

    for (j = 0; j < h; j++)
    {
        for (i = 0; i < w; i++)
        {
            int v11 = out[i+1 + (j+1)*pW];
            out[i + j*w] = v11;

            if (v11 == Oceanic)
            {
                if (out[i+1 + (j+0)*pW] != Oceanic) continue;
                if (out[i+2 + (j+1)*pW] != Oceanic) continue;
                if (out[i+0 + (j+1)*pW] != Oceanic) continue;
                if (out[i+1 + (j+2)*pW] != Oceanic) continue;

                cs = getChunkSeed(ss, i+x, j+z);
                if (mcFirstIsZero(cs, 2))
                {
                    out[i + j*w] = 1;
                }
            }
        }
    }

    return 0;
}